

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssnode_dfs.c
# Opt level: O2

int_t ssnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int_t *xprune,
                int *marker,GlobalLU_t *Glu)

{
  int iVar1;
  int_t iVar2;
  int_t *piVar3;
  long lVar4;
  int next;
  long lVar5;
  long lVar6;
  int_t nzlmax;
  int local_80;
  int local_7c;
  int_t *local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  int *local_50;
  int_t *local_48;
  int *local_40;
  int_t *local_38;
  
  local_50 = Glu->xsup;
  local_40 = Glu->supno;
  piVar3 = Glu->lsub;
  local_78 = Glu->xlsub;
  nzlmax = Glu->nzlmax;
  lVar5 = (long)jcol;
  local_58 = (long)local_40[lVar5];
  local_7c = local_40[lVar5] + 1;
  local_40[lVar5] = local_7c;
  next = local_78[lVar5];
  local_70 = (long)kcol;
  local_80 = jcol;
  local_60 = lVar5;
  local_48 = xprune;
  local_38 = xa_begin;
  for (; lVar5 <= local_70; lVar5 = lVar5 + 1) {
    local_68 = lVar5;
    for (lVar6 = (long)local_38[lVar5]; lVar6 < xa_end[lVar5]; lVar6 = lVar6 + 1) {
      iVar1 = asub[lVar6];
      if (marker[iVar1] != kcol) {
        marker[iVar1] = kcol;
        lVar4 = (long)next;
        next = next + 1;
        piVar3[lVar4] = iVar1;
        if (nzlmax <= next) {
          iVar2 = sLUMemXpand(local_80,next,LSUB,&nzlmax,Glu);
          if (iVar2 != 0) {
            return iVar2;
          }
          piVar3 = Glu->lsub;
          lVar5 = local_68;
        }
      }
    }
    local_40[lVar5] = local_7c;
  }
  if (local_80 < kcol) {
    local_68 = CONCAT44(local_68._4_4_,kcol);
    iVar1 = local_78[local_60];
    while (nzlmax < next * 2 - iVar1) {
      iVar2 = sLUMemXpand(local_80,next,LSUB,&nzlmax,Glu);
      if (iVar2 != 0) {
        return iVar2;
      }
      piVar3 = Glu->lsub;
    }
    iVar1 = local_78[local_60];
    for (lVar5 = 0; iVar1 + lVar5 < (long)next; lVar5 = lVar5 + 1) {
      piVar3[next + lVar5] = piVar3[iVar1 + lVar5];
    }
    for (; local_60 < local_70; local_60 = local_60 + 1) {
      local_78[local_60 + 1] = next;
    }
    next = next + (int)lVar5;
    kcol = (int)local_68;
  }
  local_50[local_58 + 2] = kcol + 1;
  local_40[local_70 + 1] = local_7c;
  local_48[local_70] = next;
  local_78[local_70 + 1] = next;
  return 0;
}

Assistant:

int_t
ssnode_dfs (
	   const int   jcol,	    /* in - start of the supernode */
	   const int   kcol, 	    /* in - end of the supernode */
	   const int_t *asub,        /* in */
	   const int_t *xa_begin,    /* in */
	   const int_t *xa_end,      /* in */
	   int_t      *xprune,      /* out */
	   int        *marker,      /* modified */
	   GlobalLU_t *Glu          /* modified */
	   )
{

    int_t i, k, ifrom, ito, nextl, new_next, nzlmax;
    int   nsuper, krow, kmark;
    int_t mem_error;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++) {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++) {	
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol ) { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax ) {
		    mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		    if ( mem_error ) return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
    	}
	supno[i] = nsuper;
    }

    /* Supernode > 1, then make a copy of the subscripts for pruning */
    if ( jcol < kcol ) {
	new_next = nextl + (nextl - xlsub[jcol]);
	while ( new_next > nzlmax ) {
	    mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
	    if ( mem_error ) return (mem_error);
	    lsub = Glu->lsub;
	}
	ito = nextl;
	for (ifrom = xlsub[jcol]; ifrom < nextl; )
	    lsub[ito++] = lsub[ifrom++];	
        for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;
	nextl = ito;
    }

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xprune[kcol]   = nextl;
    xlsub[kcol+1]  = nextl;

    return 0;
}